

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O2

void __thiscall gurkenlaeufer::ScenarioState::~ScenarioState(ScenarioState *this)

{
  ~ScenarioState(this);
  operator_delete(this);
  return;
}

Assistant:

ScenarioState(IParserStateFactory& factory, bool scenarioOutline, const std::string& description, std::list<Step> backgroundSteps, std::list<Step> tags, const IScenarioCollectionSPtr& testcases)
        : CommonParserState(factory)
        , _scenarioOutline(scenarioOutline)
        , _backgroundSteps(std::move(backgroundSteps))
        , _scenarioCollection(testcases)
        , _withinDocString(false)
    {
        _scenario.description = description;
        _scenario.mainSteps = _backgroundSteps;
        _scenario.tags = tags;
    }